

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O2

void wait_n_cv_ping_pong(ping_pong *pp,int parity)

{
  uint uVar1;
  nsync_time abs_deadline;
  nsync_waitable_s *pwaitable;
  nsync_waitable_s waitable;
  
  pwaitable = &waitable;
  waitable.v = pp->cv + parity;
  waitable.funcs = &nsync_cv_waitable_funcs;
  nsync_mu_lock(&pp->mu);
  while (uVar1 = pp->i, (int)uVar1 < pp->limit) {
    while ((uVar1 & 1) == parity) {
      abs_deadline.tv_nsec = 999999999;
      abs_deadline.tv_sec = 0x7fffffffffffffff;
      nsync_wait_n(pp,nsync_mu_lock,nsync_mu_unlock,abs_deadline,1,&pwaitable);
      uVar1 = pp->i;
    }
    pp->i = uVar1 + 1;
    nsync_cv_signal(pp->cv + (1 - parity));
  }
  nsync_mu_unlock(&pp->mu);
  ping_pong_done(pp);
  return;
}

Assistant:

static void wait_n_cv_ping_pong (ping_pong *pp, int parity) {
	struct nsync_waitable_s waitable;
	struct nsync_waitable_s *pwaitable = &waitable;
	waitable.v = &pp->cv[parity];
	waitable.funcs = &nsync_cv_waitable_funcs;
	nsync_mu_lock (&pp->mu);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_wait_n (&pp->mu, (void (*) (void *)) &nsync_mu_lock,
				      (void (*) (void *)) &nsync_mu_unlock,
				      nsync_time_no_deadline, 1, &pwaitable);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1 - parity]);
	}
	nsync_mu_unlock (&pp->mu);
	ping_pong_done (pp);
}